

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O1

string * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
::vertices_to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
          *this)

{
  integer_iterator<unsigned_long> iVar1;
  Graph_vertex *pGVar2;
  value_type vVar3;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  __begin0;
  ostringstream stream;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  local_1f8;
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  local_1d8;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
  *local_1c0;
  value_type local_1b8;
  value_type local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  ::Vertex_iterator(&local_1d8,
                    (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                     *)this);
  vVar3 = (*(long *)(this + 0x58) - *(long *)(this + 0x50) >> 3) * 0x2e8ba2e8ba2e8ba3;
  local_1f8.vertexIterator.second.m_value = local_1d8.vertexIterator.second.m_value;
  local_1f8.complex = local_1d8.complex;
  local_1f8.vertexIterator.first.m_value = local_1d8.vertexIterator.first.m_value;
  local_1c0 = this;
  local_1b8 = vVar3;
  local_1b0 = vVar3;
  while (((iVar1.m_value = local_1f8.vertexIterator.first.m_value,
          local_1f8.vertexIterator.first.m_value != vVar3 ||
          (local_1f8.vertexIterator.second.m_value != vVar3)) ||
         (local_1f8.complex !=
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
           *)this))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
    pGVar2 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
             ::operator[]((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                           *)this,(Vertex_handle)(boost_vertex_handle)iVar1.m_value);
    std::ostream::operator<<((ostream *)local_1a8,(pGVar2->super_Simple_vertex).id_.vertex);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} ",2);
    Vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
    ::goto_next_valid(&local_1f8);
  }
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string vertices_to_string() const {
    std::ostringstream stream;
    for (auto vertex : vertex_range()) {
      stream << "{" << (*this)[vertex].get_id() << "} ";
    }
    stream << std::endl;
    return stream.str();
  }